

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<long_double>::PrepareZ
          (TPZMatrix<long_double> *this,TPZFMatrix<long_double> *y,TPZFMatrix<long_double> *z,
          longdouble beta,int opt)

{
  long lVar1;
  long lVar2;
  longdouble *plVar3;
  long lVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  lVar1 = (&(this->super_TPZBaseMatrix).fRow)[opt != 0];
  lVar2 = (y->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  (*(z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (z,lVar1,lVar2);
  if (0 < lVar2) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      if (((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow < 1) ||
         ((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar7)) {
        TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar8 = (z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
      plVar3 = z->fElem;
      if ((beta != (longdouble)0) || (NAN(beta) || NAN((longdouble)0))) {
        if (z != y) {
          memcpy(plVar3 + lVar8 * lVar7,
                 y->fElem + (y->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow * lVar7,
                 lVar1 << 4);
        }
        if (0 < lVar1) {
          lVar9 = 0;
          lVar8 = 0;
          do {
            if (((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow <= lVar8) ||
               ((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar7)) {
              TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
              ;
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar4 = (z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow * lVar6;
            *(longdouble *)((long)z->fElem + lVar9 + lVar4) =
                 beta * *(longdouble *)((long)z->fElem + lVar9 + lVar4);
            lVar8 = lVar8 + 1;
            lVar9 = lVar9 + 0x10;
          } while (lVar1 != lVar8);
        }
      }
      else if (lVar1 != 0) {
        sVar5 = 0;
        do {
          *(longdouble *)((long)plVar3 + sVar5 + lVar8 * lVar6) = (longdouble)0;
          sVar5 = sVar5 + 0x10;
        } while (lVar1 << 4 != sVar5);
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar7 != lVar2);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::PrepareZ(const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,const TVar beta,const int opt) const
{
	int64_t numeq = (opt) ? Cols() : Rows();
	int64_t xcols = y.Cols();
	int64_t ic;
	z.Resize(numeq, xcols);
	for (ic = 0; ic < xcols; ic++)
	{
		TVar *zp = &z(0,ic), *zlast = zp+numeq;
		if(beta != (TVar)0)
		{
			const TVar *yp = &y.g(0,ic);
            if(&z != &y)
			{
				memcpy((void *)(zp),(void *)(yp),numeq*sizeof(TVar));
			}
            for (int64_t i=0; i<numeq; i++) {
                z(i,ic) *= beta;
            }
		} else
		{
			while(zp != zlast)
			{
				*zp = 0.;
				zp ++;
			}
		}
	}
}